

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.h
# Opt level: O3

QDebug operator<<(QDebug debug,QKeyCombination combination)

{
  QTextStream *this;
  Stream *pSVar1;
  QDebug QVar2;
  uint in_EDX;
  undefined4 in_register_00000034;
  QDebug *pQVar3;
  long in_FS_OFFSET;
  QByteArrayView QVar4;
  QByteArrayView QVar5;
  QByteArrayView QVar6;
  QDebugStateSaver saver;
  QDebug local_70;
  QDebug local_68;
  QDebug local_60;
  QDebug local_58;
  undefined1 *local_50;
  QArrayData *local_48 [3];
  long local_30;
  
  pQVar3 = (QDebug *)CONCAT44(in_register_00000034,combination.combination);
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_50 = &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)&local_50,pQVar3);
  this = (QTextStream *)pQVar3->stream;
  this[0x30] = (QTextStream)0x0;
  QVar4.m_data = (storage_type *)0x10;
  QVar4.m_size = (qsizetype)local_48;
  QString::fromUtf8(QVar4);
  QTextStream::operator<<(this,(QString *)local_48);
  if (local_48[0] != (QArrayData *)0x0) {
    LOCK();
    (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_48[0],2,0x10);
    }
  }
  local_70.stream = pQVar3->stream;
  if (((QTextStream *)local_70.stream)[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<((QTextStream *)local_70.stream,' ');
    local_70.stream = pQVar3->stream;
  }
  *(int *)((QTextStream *)local_70.stream + 0x28) =
       *(int *)((QTextStream *)local_70.stream + 0x28) + 1;
  qt_QMetaEnum_flagDebugOperator
            (&local_68,(ulonglong)&local_70,(QMetaObject *)(ulong)(in_EDX & 0xfe000000),
             (char *)&Qt::staticMetaObject);
  QVar2.stream = local_68.stream;
  QVar5.m_data = (storage_type *)0x2;
  QVar5.m_size = (qsizetype)local_48;
  QString::fromUtf8(QVar5);
  QTextStream::operator<<((QTextStream *)QVar2.stream,(QString *)local_48);
  if (local_48[0] != (QArrayData *)0x0) {
    LOCK();
    (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_48[0],2,0x10);
    }
  }
  if (*(QTextStream *)(local_68.stream + 0x30) == (QTextStream)0x1) {
    QTextStream::operator<<((QTextStream *)local_68.stream,' ');
  }
  *(int *)((QTextStream *)local_68.stream + 0x28) =
       *(int *)((QTextStream *)local_68.stream + 0x28) + 1;
  qt_QMetaEnum_debugOperator
            (&local_58,(longlong)&local_60,(QMetaObject *)(ulong)(in_EDX & 0x1ffffff),
             (char *)&Qt::staticMetaObject);
  QVar2.stream = local_58.stream;
  QVar6.m_data = (storage_type *)0x1;
  QVar6.m_size = (qsizetype)local_48;
  QString::fromUtf8(QVar6);
  QTextStream::operator<<((QTextStream *)QVar2.stream,(QString *)local_48);
  if (local_48[0] != (QArrayData *)0x0) {
    LOCK();
    (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_48[0],2,0x10);
    }
  }
  if (*(QTextStream *)(local_58.stream + 0x30) == (QTextStream)0x1) {
    QTextStream::operator<<((QTextStream *)local_58.stream,' ');
  }
  QDebug::~QDebug(&local_58);
  QDebug::~QDebug(&local_60);
  QDebug::~QDebug(&local_68);
  QDebug::~QDebug(&local_70);
  pSVar1 = pQVar3->stream;
  pQVar3->stream = (Stream *)0x0;
  *(Stream **)debug.stream = pSVar1;
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (QDebug)debug.stream;
  }
  __stack_chk_fail();
}

Assistant:

inline QDebug operator<<(QDebug debug, QKeyCombination combination)
{
    QDebugStateSaver saver(debug);
    debug.nospace() << "QKeyCombination("
                    << combination.keyboardModifiers()
                    << ", "
                    << combination.key()
                    << ")";
    return debug;
}